

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScriptGenerator.cxx
# Opt level: O0

void __thiscall cmScriptGenerator::~cmScriptGenerator(cmScriptGenerator *this)

{
  cmScriptGenerator *this_local;
  
  this->_vptr_cmScriptGenerator = (_func_int **)&PTR__cmScriptGenerator_00a57168;
  std::__cxx11::string::~string((string *)&this->ConfigurationName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Configurations);
  std::__cxx11::string::~string((string *)&this->RuntimeConfigVariable);
  return;
}

Assistant:

cmScriptGenerator
::~cmScriptGenerator()
{
}